

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O2

_Bool al_set_audio_stream_gain(ALLEGRO_AUDIO_STREAM *stream,float val)

{
  float fVar1;
  ALLEGRO_MIXER *mixer_00;
  ALLEGRO_MUTEX *mutex;
  _Bool _Var2;
  ALLEGRO_MIXER *mixer;
  
  mixer_00 = (stream->spl).parent.u.mixer;
  if (mixer_00 == (ALLEGRO_MIXER *)0x0) {
    fVar1 = (stream->spl).gain;
    _Var2 = true;
    if ((fVar1 != val) || (NAN(fVar1) || NAN(val))) {
      (stream->spl).gain = val;
    }
  }
  else if ((stream->spl).parent.is_voice == true) {
    _al_set_error(0xff,"Could not set gain of stream attached to voice");
    _Var2 = false;
  }
  else {
    fVar1 = (stream->spl).gain;
    _Var2 = true;
    if ((fVar1 != val) || (NAN(fVar1) || NAN(val))) {
      (stream->spl).gain = val;
      mutex = (stream->spl).mutex;
      maybe_lock_mutex(mutex);
      _al_kcm_mixer_rejig_sample_matrix(mixer_00,&stream->spl);
      maybe_unlock_mutex(mutex);
    }
  }
  return _Var2;
}

Assistant:

bool al_set_audio_stream_gain(ALLEGRO_AUDIO_STREAM *stream, float val)
{
   ASSERT(stream);

   if (stream->spl.parent.u.ptr && stream->spl.parent.is_voice) {
      _al_set_error(ALLEGRO_GENERIC_ERROR,
         "Could not set gain of stream attached to voice");
      return false;
   }

   if (stream->spl.gain != val) {
      stream->spl.gain = val;

      /* If attached to a mixer already, need to recompute the sample
       * matrix to take into account the gain.
       */
      if (stream->spl.parent.u.mixer) {
         ALLEGRO_MIXER *mixer = stream->spl.parent.u.mixer;
         ALLEGRO_MUTEX *stream_mutex = maybe_lock_mutex(stream->spl.mutex);
         _al_kcm_mixer_rejig_sample_matrix(mixer, &stream->spl);
         maybe_unlock_mutex(stream_mutex);
      }
   }

   return true;
}